

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_columnref.cpp
# Opt level: O2

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::Transformer::TransformStarExpression(Transformer *this,PGAStar *star)

{
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var1;
  _Alloc_hider _Var2;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var3;
  bool bVar4;
  PGList *pPVar5;
  pointer pSVar6;
  iterator iVar7;
  PGValue *pPVar8;
  iterator iVar9;
  iterator iVar10;
  type a;
  BaseExpression *this_00;
  StarExpression *pSVar11;
  pointer pPVar12;
  type expr;
  ParserException *pPVar13;
  idx_t in_RDX;
  undefined8 *puVar14;
  allocator local_289;
  unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true> local_288;
  optional_ptr<duckdb_libpgquery::PGList,_true> list_1;
  allocator local_271;
  idx_t local_270;
  optional_ptr<duckdb_libpgquery::PGValue,_true> value;
  optional_ptr<duckdb_libpgquery::PGList,_true> exclude_column_list;
  QualifiedColumnName exclude_column;
  string replace_entry;
  key_type local_138;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_118;
  string local_110;
  string local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  if (*(char **)(in_RDX + 8) == (char *)0x0) {
    exclude_column.catalog._M_string_length = 0;
    exclude_column.catalog.field_2._M_allocated_capacity =
         exclude_column.catalog.field_2._M_allocated_capacity & 0xffffffffffffff00;
    exclude_column.catalog._M_dataplus._M_p = (pointer)&exclude_column.catalog.field_2;
  }
  else {
    ::std::__cxx11::string::string((string *)&exclude_column,*(char **)(in_RDX + 8),&local_271);
  }
  make_uniq<duckdb::StarExpression,std::__cxx11::string>
            ((duckdb *)&local_288,&exclude_column.catalog);
  ::std::__cxx11::string::~string((string *)&exclude_column);
  puVar14 = *(undefined8 **)(in_RDX + 0x18);
  local_270 = in_RDX;
  if (puVar14 != (undefined8 *)0x0) {
    while (puVar14 = (undefined8 *)puVar14[1], puVar14 != (undefined8 *)0x0) {
      exclude_column_list.ptr = (PGList *)*puVar14;
      pPVar5 = optional_ptr<duckdb_libpgquery::PGList,_true>::operator*(&exclude_column_list);
      TransformQualifiedColumnName(&exclude_column,pPVar5);
      pSVar6 = unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
               ::operator->(&local_288);
      iVar7 = ::std::
              _Hashtable<duckdb::QualifiedColumnName,_duckdb::QualifiedColumnName,_std::allocator<duckdb::QualifiedColumnName>,_std::__detail::_Identity,_duckdb::QualifiedColumnEquality,_duckdb::QualifiedColumnHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::find(&(pSVar6->exclude_list)._M_h,&exclude_column);
      unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>::
      operator->(&local_288);
      if (iVar7.super__Node_iterator_base<duckdb::QualifiedColumnName,_true>._M_cur !=
          (__node_type *)0x0) {
        pPVar13 = (ParserException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&replace_entry,"Duplicate entry \"%s\" in EXCLUDE list",
                   (allocator *)&list_1);
        QualifiedColumnName::ToString_abi_cxx11_(&local_50,&exclude_column);
        ParserException::ParserException<std::__cxx11::string>(pPVar13,&replace_entry,&local_50);
        __cxa_throw(pPVar13,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
      }
      pSVar6 = unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
               ::operator->(&local_288);
      ::std::__detail::
      _Insert<duckdb::QualifiedColumnName,_duckdb::QualifiedColumnName,_std::allocator<duckdb::QualifiedColumnName>,_std::__detail::_Identity,_duckdb::QualifiedColumnEquality,_duckdb::QualifiedColumnHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
      ::insert((_Insert<duckdb::QualifiedColumnName,_duckdb::QualifiedColumnName,_std::allocator<duckdb::QualifiedColumnName>,_std::__detail::_Identity,_duckdb::QualifiedColumnEquality,_duckdb::QualifiedColumnHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
                *)&pSVar6->exclude_list,&exclude_column);
      QualifiedColumnName::~QualifiedColumnName(&exclude_column);
    }
  }
  puVar14 = *(undefined8 **)(local_270 + 0x20);
  local_118._M_head_impl = (ParsedExpression *)this;
  if (puVar14 != (undefined8 *)0x0) {
    while (puVar14 = (undefined8 *)puVar14[1], puVar14 != (undefined8 *)0x0) {
      exclude_column_list.ptr = (PGList *)*puVar14;
      optional_ptr<duckdb_libpgquery::PGList,_true>::operator->(&exclude_column_list);
      TransformExpression((Transformer *)&list_1,(optional_ptr<duckdb_libpgquery::PGNode,_true>)star
                         );
      pPVar5 = optional_ptr<duckdb_libpgquery::PGList,_true>::operator->(&exclude_column_list);
      value.ptr = *(PGValue **)&pPVar5->tail->data;
      pPVar8 = optional_ptr<duckdb_libpgquery::PGValue,_true>::operator->(&value);
      ::std::__cxx11::string::string
                ((string *)&replace_entry,(pPVar8->val).str,(allocator *)&exclude_column);
      pSVar6 = unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
               ::operator->(&local_288);
      iVar9 = ::std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&(pSVar6->replace_list)._M_h,&replace_entry);
      unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>::
      operator->(&local_288);
      if (iVar9.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>,_true>
          ._M_cur != (__node_type *)0x0) {
        pPVar13 = (ParserException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&exclude_column,"Duplicate entry \"%s\" in REPLACE list",&local_289);
        ::std::__cxx11::string::string((string *)&local_70,(string *)&replace_entry);
        ParserException::ParserException<std::__cxx11::string>
                  (pPVar13,&exclude_column.catalog,&local_70);
        __cxa_throw(pPVar13,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
      }
      pSVar6 = unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
               ::operator->(&local_288);
      ::std::__cxx11::string::string((string *)&local_90,(string *)&replace_entry);
      QualifiedColumnName::QualifiedColumnName(&exclude_column,&local_90);
      iVar7 = ::std::
              _Hashtable<duckdb::QualifiedColumnName,_duckdb::QualifiedColumnName,_std::allocator<duckdb::QualifiedColumnName>,_std::__detail::_Identity,_duckdb::QualifiedColumnEquality,_duckdb::QualifiedColumnHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::find(&(pSVar6->exclude_list)._M_h,&exclude_column);
      unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>::
      operator->(&local_288);
      QualifiedColumnName::~QualifiedColumnName(&exclude_column);
      ::std::__cxx11::string::~string((string *)&local_90);
      if (iVar7.super__Node_iterator_base<duckdb::QualifiedColumnName,_true>._M_cur !=
          (__node_type *)0x0) {
        pPVar13 = (ParserException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&exclude_column,
                   "Column \"%s\" cannot occur in both EXCLUDE and REPLACE list",&local_289);
        ::std::__cxx11::string::string((string *)&local_b0,(string *)&replace_entry);
        ParserException::ParserException<std::__cxx11::string>
                  (pPVar13,&exclude_column.catalog,&local_b0);
        __cxa_throw(pPVar13,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
      }
      pSVar6 = unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
               ::operator->(&local_288);
      exclude_column.catalog._M_string_length = replace_entry._M_string_length;
      exclude_column.catalog._M_dataplus._M_p = (pointer)&exclude_column.catalog.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)replace_entry._M_dataplus._M_p == &replace_entry.field_2) {
        exclude_column.catalog.field_2._8_4_ = replace_entry.field_2._8_4_;
        exclude_column.catalog.field_2._12_4_ = replace_entry.field_2._12_4_;
      }
      else {
        exclude_column.catalog._M_dataplus = replace_entry._M_dataplus;
      }
      exclude_column.catalog.field_2._M_allocated_capacity._4_4_ =
           replace_entry.field_2._M_allocated_capacity._4_4_;
      exclude_column.catalog.field_2._M_allocated_capacity._0_4_ =
           replace_entry.field_2._M_allocated_capacity._0_4_;
      replace_entry._M_string_length = 0;
      replace_entry.field_2._M_allocated_capacity._0_4_ =
           replace_entry.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
      exclude_column.schema._M_dataplus._M_p = (pointer)list_1.ptr;
      list_1.ptr = (PGList *)0x0;
      replace_entry._M_dataplus._M_p = (pointer)&replace_entry.field_2;
      ::std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::
      _M_emplace<std::pair<std::__cxx11::string,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)&pSVar6->replace_list,&exclude_column);
      ::std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>
      ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>
               *)&exclude_column);
      ::std::__cxx11::string::~string((string *)&replace_entry);
      if (list_1.ptr != (PGList *)0x0) {
        (**(code **)(*(long *)list_1.ptr + 8))();
      }
    }
  }
  puVar14 = *(undefined8 **)(local_270 + 0x28);
  if (puVar14 != (undefined8 *)0x0) {
    while (puVar14 = (undefined8 *)puVar14[1], puVar14 != (undefined8 *)0x0) {
      list_1.ptr = (PGList *)*puVar14;
      pPVar5 = optional_ptr<duckdb_libpgquery::PGList,_true>::operator->(&list_1);
      value.ptr = *(PGValue **)&pPVar5->head->data;
      pPVar5 = optional_ptr<duckdb_libpgquery::PGList,_true>::operator*
                         ((optional_ptr<duckdb_libpgquery::PGList,_true> *)&value);
      TransformQualifiedColumnName((QualifiedColumnName *)&replace_entry,pPVar5);
      pPVar5 = optional_ptr<duckdb_libpgquery::PGList,_true>::operator->(&list_1);
      ::std::__cxx11::string::string
                ((string *)&exclude_column_list,(char *)(pPVar5->tail->data).ptr_value,
                 (allocator *)&exclude_column);
      pSVar6 = unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
               ::operator->(&local_288);
      iVar10 = ::std::
               _Hashtable<duckdb::QualifiedColumnName,_std::pair<const_duckdb::QualifiedColumnName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_duckdb::QualifiedColumnName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_duckdb::QualifiedColumnEquality,_duckdb::QualifiedColumnHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               ::find(&(pSVar6->rename_list)._M_h,(QualifiedColumnName *)&replace_entry);
      unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>::
      operator->(&local_288);
      if (iVar10.
          super__Node_iterator_base<std::pair<const_duckdb::QualifiedColumnName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
          ._M_cur != (__node_type *)0x0) {
        pPVar13 = (ParserException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&exclude_column,"Duplicate entry \"%s\" in EXCLUDE list",&local_289);
        QualifiedColumnName::ToString_abi_cxx11_(&local_d0,(QualifiedColumnName *)&replace_entry);
        ParserException::ParserException<std::__cxx11::string>
                  (pPVar13,&exclude_column.catalog,&local_d0);
        __cxa_throw(pPVar13,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
      }
      pSVar6 = unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
               ::operator->(&local_288);
      iVar7 = ::std::
              _Hashtable<duckdb::QualifiedColumnName,_duckdb::QualifiedColumnName,_std::allocator<duckdb::QualifiedColumnName>,_std::__detail::_Identity,_duckdb::QualifiedColumnEquality,_duckdb::QualifiedColumnHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::find(&(pSVar6->exclude_list)._M_h,(QualifiedColumnName *)&replace_entry);
      unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>::
      operator->(&local_288);
      if (iVar7.super__Node_iterator_base<duckdb::QualifiedColumnName,_true>._M_cur !=
          (__node_type *)0x0) {
        pPVar13 = (ParserException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&exclude_column,
                   "Column \"%s\" cannot occur in both EXCLUDE and RENAME list",&local_289);
        QualifiedColumnName::ToString_abi_cxx11_(&local_f0,(QualifiedColumnName *)&replace_entry);
        ParserException::ParserException<std::__cxx11::string>
                  (pPVar13,&exclude_column.catalog,&local_f0);
        __cxa_throw(pPVar13,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
      }
      pSVar6 = unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
               ::operator->(&local_288);
      iVar9 = ::std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&(pSVar6->replace_list)._M_h,&local_138);
      unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>::
      operator->(&local_288);
      if (iVar9.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>,_true>
          ._M_cur != (__node_type *)0x0) {
        pPVar13 = (ParserException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&exclude_column,
                   "Column \"%s\" cannot occur in both REPLACE and RENAME list",&local_289);
        QualifiedColumnName::ToString_abi_cxx11_(&local_110,(QualifiedColumnName *)&replace_entry);
        ParserException::ParserException<std::__cxx11::string>
                  (pPVar13,&exclude_column.catalog,&local_110);
        __cxa_throw(pPVar13,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
      }
      pSVar6 = unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
               ::operator->(&local_288);
      ::std::
      pair<duckdb::QualifiedColumnName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<duckdb::QualifiedColumnName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ((pair<duckdb::QualifiedColumnName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&exclude_column,(QualifiedColumnName *)&replace_entry,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &exclude_column_list);
      ::std::
      _Hashtable<duckdb::QualifiedColumnName,std::pair<duckdb::QualifiedColumnName_const,std::__cxx11::string>,std::allocator<std::pair<duckdb::QualifiedColumnName_const,std::__cxx11::string>>,std::__detail::_Select1st,duckdb::QualifiedColumnEquality,duckdb::QualifiedColumnHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_M_emplace<std::pair<duckdb::QualifiedColumnName,std::__cxx11::string>>
                ((_Hashtable<duckdb::QualifiedColumnName,std::pair<duckdb::QualifiedColumnName_const,std::__cxx11::string>,std::allocator<std::pair<duckdb::QualifiedColumnName_const,std::__cxx11::string>>,std::__detail::_Select1st,duckdb::QualifiedColumnEquality,duckdb::QualifiedColumnHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)&pSVar6->rename_list,
                 (pair<duckdb::QualifiedColumnName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&exclude_column);
      ::std::
      pair<duckdb::QualifiedColumnName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair((pair<duckdb::QualifiedColumnName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&exclude_column);
      ::std::__cxx11::string::~string((string *)&exclude_column_list);
      QualifiedColumnName::~QualifiedColumnName((QualifiedColumnName *)&replace_entry);
    }
  }
  _Var3._M_head_impl = (ParsedExpression *)local_118;
  if (*(long *)(local_270 + 0x10) != 0) {
    TransformExpression((Transformer *)&exclude_column,
                        (optional_ptr<duckdb_libpgquery::PGNode,_true>)star);
    pSVar6 = unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>::
             operator->(&local_288);
    _Var2 = exclude_column.catalog._M_dataplus;
    exclude_column.catalog._M_dataplus._M_p = (pointer)0x0;
    _Var1._M_head_impl =
         (pSVar6->expr).
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    (pSVar6->expr).
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
         (ParsedExpression *)_Var2._M_p;
    if (_Var1._M_head_impl != (ParsedExpression *)0x0) {
      (**(code **)(*(long *)&(_Var1._M_head_impl)->super_BaseExpression + 8))();
      if (exclude_column.catalog._M_dataplus._M_p != (pointer)0x0) {
        (**(code **)(*(long *)exclude_column.catalog._M_dataplus._M_p + 8))();
      }
    }
    pSVar6 = unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>::
             operator->(&local_288);
    a = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
        operator*(&pSVar6->expr);
    bVar4 = StarExpression::IsStar(a);
    if (bVar4) {
      pSVar6 = unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
               ::operator->(&local_288);
      this_00 = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 ::operator->(&pSVar6->expr)->super_BaseExpression;
      pSVar11 = BaseExpression::Cast<duckdb::StarExpression>(this_00);
      pSVar6 = unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
               ::operator->(&local_288);
      ::std::__cxx11::string::_M_assign((string *)&pSVar6->relation_name);
      pSVar6 = unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
               ::operator->(&local_288);
      ::std::
      _Hashtable<duckdb::QualifiedColumnName,_duckdb::QualifiedColumnName,_std::allocator<duckdb::QualifiedColumnName>,_std::__detail::_Identity,_duckdb::QualifiedColumnEquality,_duckdb::QualifiedColumnHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::operator=(&(pSVar6->exclude_list)._M_h,&(pSVar11->exclude_list)._M_h);
      pSVar6 = unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
               ::operator->(&local_288);
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::operator=(&(pSVar6->replace_list)._M_h,&(pSVar11->replace_list)._M_h);
      pSVar6 = unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
               ::operator->(&local_288);
      ::std::
      _Hashtable<duckdb::QualifiedColumnName,_std::pair<const_duckdb::QualifiedColumnName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_duckdb::QualifiedColumnName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_duckdb::QualifiedColumnEquality,_duckdb::QualifiedColumnHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::operator=(&(pSVar6->rename_list)._M_h,&(pSVar11->rename_list)._M_h);
      pSVar6 = unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
               ::operator->(&local_288);
      _Var1._M_head_impl =
           (pSVar6->expr).
           super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
           ._M_t.
           super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
           .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
      (pSVar6->expr).
      super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
           (ParsedExpression *)0x0;
      if (_Var1._M_head_impl != (ParsedExpression *)0x0) {
        (**(code **)(*(long *)&(_Var1._M_head_impl)->super_BaseExpression + 8))();
      }
    }
    else {
      pSVar6 = unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
               ::operator->(&local_288);
      pPVar12 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                ::operator->(&pSVar6->expr);
      if ((pPVar12->super_BaseExpression).type == LAMBDA) {
        exclude_column.catalog._M_dataplus._M_p = (pointer)0x0;
        exclude_column.catalog._M_string_length = 0;
        exclude_column.catalog.field_2._M_allocated_capacity = 0;
        make_uniq<duckdb::StarExpression>();
        replace_entry._M_dataplus._M_p = (pointer)exclude_column_list;
        exclude_column_list.ptr = (PGList *)0x0;
        ::std::
        vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                    *)&exclude_column,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)&replace_entry);
        if (replace_entry._M_dataplus._M_p != (pointer)0x0) {
          (**(code **)(*(long *)replace_entry._M_dataplus._M_p + 8))();
        }
        replace_entry._M_dataplus._M_p = (pointer)0x0;
        if (exclude_column_list.ptr != (PGList *)0x0) {
          (**(code **)(*(long *)exclude_column_list.ptr + 8))();
        }
        pSVar6 = unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
                 ::operator->(&local_288);
        ::std::
        vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                    *)&exclude_column,&pSVar6->expr);
        make_uniq<duckdb::FunctionExpression,char_const(&)[12],duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
                  ((duckdb *)&replace_entry,(char (*) [12])"list_filter",
                   (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                    *)&exclude_column);
        _Var2 = replace_entry._M_dataplus;
        replace_entry._M_dataplus._M_p = (pointer)0x0;
        pSVar6 = unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
                 ::operator->(&local_288);
        _Var1._M_head_impl =
             (pSVar6->expr).
             super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
             ._M_t.
             super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
             .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
        (pSVar6->expr).
        super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
        _M_t.
        super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
        .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
             (ParsedExpression *)_Var2._M_p;
        if (_Var1._M_head_impl != (ParsedExpression *)0x0) {
          (**(code **)(*(long *)&(_Var1._M_head_impl)->super_BaseExpression + 8))();
        }
        if (replace_entry._M_dataplus._M_p != (pointer)0x0) {
          (**(code **)(*(long *)replace_entry._M_dataplus._M_p + 8))();
        }
        ::std::
        vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        ::~vector((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                   *)&exclude_column);
      }
    }
  }
  bVar4 = *(bool *)(local_270 + 0x30);
  pSVar6 = unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>::
           operator->(&local_288);
  pSVar6->columns = bVar4;
  expr = unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>::
         operator*(&local_288);
  SetQueryLocation(&expr->super_ParsedExpression,*(int *)(local_270 + 0x34));
  *(unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>_> *)
   _Var3._M_head_impl =
       local_288.
       super_unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>_>._M_t.
       super___uniq_ptr_impl<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::StarExpression_*,_std::default_delete<duckdb::StarExpression>_>
       .super__Head_base<0UL,_duckdb::StarExpression_*,_false>._M_head_impl;
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
          )_Var3._M_head_impl;
}

Assistant:

unique_ptr<ParsedExpression> Transformer::TransformStarExpression(duckdb_libpgquery::PGAStar &star) {
	auto result = make_uniq<StarExpression>(star.relation ? star.relation : string());
	if (star.except_list) {
		for (auto head = star.except_list->head; head; head = head->next) {
			auto exclude_column_list = PGPointerCast<duckdb_libpgquery::PGList>(head->data.ptr_value);
			auto exclude_column = TransformQualifiedColumnName(*exclude_column_list);
			// qualified - add to exclude list
			if (result->exclude_list.find(exclude_column) != result->exclude_list.end()) {
				throw ParserException("Duplicate entry \"%s\" in EXCLUDE list", exclude_column.ToString());
			}
			result->exclude_list.insert(std::move(exclude_column));
		}
	}
	if (star.replace_list) {
		for (auto head = star.replace_list->head; head; head = head->next) {
			auto list = PGPointerCast<duckdb_libpgquery::PGList>(head->data.ptr_value);
			D_ASSERT(list->length == 2);
			auto replace_expression =
			    TransformExpression(PGPointerCast<duckdb_libpgquery::PGNode>(list->head->data.ptr_value));
			auto value = PGPointerCast<duckdb_libpgquery::PGValue>(list->tail->data.ptr_value);
			D_ASSERT(value->type == duckdb_libpgquery::T_PGString);
			string replace_entry = value->val.str;
			if (result->replace_list.find(replace_entry) != result->replace_list.end()) {
				throw ParserException("Duplicate entry \"%s\" in REPLACE list", replace_entry);
			}
			if (result->exclude_list.find(QualifiedColumnName(replace_entry)) != result->exclude_list.end()) {
				throw ParserException("Column \"%s\" cannot occur in both EXCLUDE and REPLACE list", replace_entry);
			}
			result->replace_list.insert(make_pair(std::move(replace_entry), std::move(replace_expression)));
		}
	}
	if (star.rename_list) {
		for (auto head = star.rename_list->head; head; head = head->next) {
			auto list = PGPointerCast<duckdb_libpgquery::PGList>(head->data.ptr_value);
			D_ASSERT(list->length == 2);
			auto rename_column_list = PGPointerCast<duckdb_libpgquery::PGList>(list->head->data.ptr_value);
			auto rename_column = TransformQualifiedColumnName(*rename_column_list);
			string new_name = char_ptr_cast(list->tail->data.ptr_value);
			if (result->rename_list.find(rename_column) != result->rename_list.end()) {
				throw ParserException("Duplicate entry \"%s\" in EXCLUDE list", rename_column.ToString());
			}
			if (result->exclude_list.find(rename_column) != result->exclude_list.end()) {
				throw ParserException("Column \"%s\" cannot occur in both EXCLUDE and RENAME list",
				                      rename_column.ToString());
			}
			if (result->replace_list.find(rename_column.column) != result->replace_list.end()) {
				throw ParserException("Column \"%s\" cannot occur in both REPLACE and RENAME list",
				                      rename_column.ToString());
			}
			result->rename_list.insert(make_pair(std::move(rename_column), std::move(new_name)));
		}
	}
	if (star.expr) {
		D_ASSERT(star.columns);
		D_ASSERT(result->relation_name.empty());
		D_ASSERT(result->exclude_list.empty());
		D_ASSERT(result->replace_list.empty());
		result->expr = TransformExpression(star.expr);
		if (StarExpression::IsStar(*result->expr)) {
			auto &child_star = result->expr->Cast<StarExpression>();
			result->relation_name = child_star.relation_name;
			result->exclude_list = std::move(child_star.exclude_list);
			result->replace_list = std::move(child_star.replace_list);
			result->rename_list = std::move(child_star.rename_list);
			result->expr.reset();
		} else if (result->expr->GetExpressionType() == ExpressionType::LAMBDA) {
			vector<unique_ptr<ParsedExpression>> children;
			children.push_back(make_uniq<StarExpression>());
			children.push_back(std::move(result->expr));
			auto list_filter = make_uniq<FunctionExpression>("list_filter", std::move(children));
			result->expr = std::move(list_filter);
		}
	}
	result->columns = star.columns;
	SetQueryLocation(*result, star.location);
	return std::move(result);
}